

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMBitLayout.cpp
# Opt level: O0

BitMatrix * ZXing::DataMatrix::BitMatrixFromCodewords(ByteArray *codewords,int width,int height)

{
  bool bVar1;
  undefined1 uVar2;
  BitMatrix *in_RDI;
  BitMatrix visited;
  const_iterator codeword;
  BitMatrix result;
  int in_stack_00000238;
  int in_stack_0000023c;
  anon_class_16_2_7c36c2df in_stack_00000240;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  BitMatrix *in_stack_ffffffffffffff90;
  
  BitMatrix::BitMatrix
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  VisitMatrix<ZXing::DataMatrix::BitMatrixFromCodewords(ZXing::ByteArray_const&,int,int)::__0>
            (in_stack_0000023c,in_stack_00000238,in_stack_00000240);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (bVar1) {
    memset(in_RDI,0,0x20);
    BitMatrix::BitMatrix((BitMatrix *)0x268d21);
  }
  else {
    uVar2 = BitMatrix::get((BitMatrix *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    if (!(bool)uVar2) {
      BitMatrix::set((BitMatrix *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,false);
      BitMatrix::set((BitMatrix *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,false);
    }
    BitMatrix::BitMatrix
              ((BitMatrix *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
               (BitMatrix *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  BitMatrix::~BitMatrix((BitMatrix *)0x268dfb);
  BitMatrix::~BitMatrix((BitMatrix *)0x268e08);
  return in_RDI;
}

Assistant:

BitMatrix BitMatrixFromCodewords(const ByteArray& codewords, int width, int height)
{
	BitMatrix result(width, height);

	auto codeword = codewords.begin();

	auto visited = VisitMatrix(height, width, [&codeword, &result](const BitPosArray& bitPos) {
		// Places the 8 bits of a corner or the utah-shaped symbol character in the result matrix
		uint8_t mask = 0x80;
		for (auto& p : bitPos) {
			if (*codeword & mask)
				result.set(p.col, p.row);
			mask >>= 1;
		}
		++codeword;
	});

	if (codeword != codewords.end())
		return {};

	// Lastly, if the lower righthand corner is untouched, fill in fixed pattern
	if (!visited.get(width - 1, height - 1)) {
		result.set(width - 1, height - 1);
		result.set(width - 2, height - 2);
	}

	return result;
}